

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# execmd.c
# Opt level: O0

void vocdusave_me(voccxdef *ctx,objnum old_me)

{
  int iVar1;
  uchar *puVar2;
  ushort in_SI;
  long in_RDI;
  objucxdef *uc;
  uchar *p;
  ushort in_stack_ffffffffffffffdc;
  uchar in_stack_ffffffffffffffdf;
  objucxdef *undoctx;
  
  undoctx = *(objucxdef **)(in_RDI + 0x20);
  if ((undoctx != (objucxdef *)0x0) && (iVar1 = objuok(undoctx), iVar1 != 0)) {
    puVar2 = objures(undoctx,in_stack_ffffffffffffffdf,in_stack_ffffffffffffffdc);
    *puVar2 = '\x06';
    oswp2(puVar2 + 1,(uint)in_SI);
    undoctx->objucxhead = undoctx->objucxhead + 3;
  }
  return;
}

Assistant:

void vocdusave_me(voccxdef *ctx, objnum old_me)
{
    uchar     *p;
    objucxdef *uc = ctx->voccxundo;

    /* if we don't need to save undo, there's nothing to do */
    if (uc == 0 || !objuok(uc))
        return;

    /* reserve space for our record */
    p = objures(uc, OBJUCLI, 3);
    *p = VOC_UNDO_SETME;
    oswp2(p+1, old_me);

    /* absorb the space */
    uc->objucxhead += 3;
}